

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O3

void __thiscall FIX::double_conversion::Bignum::Square(Bignum *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint *puVar5;
  uint *puVar6;
  bool bVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  
  bVar7 = IsClamped(this);
  if (!bVar7) {
    __assert_fail("IsClamped()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/bignum.cc"
                  ,0x155,"void FIX::double_conversion::Bignum::Square()");
  }
  uVar1 = this->used_digits_;
  lVar10 = (long)(int)uVar1;
  if (0x40 < lVar10) {
    abort();
  }
  if ((int)uVar1 < 1) {
    uVar8 = 0;
    uVar11 = uVar1;
  }
  else {
    puVar5 = (this->bigits_).start_;
    lVar13 = 0;
    lVar14 = lVar10;
    do {
      iVar2 = (this->bigits_).length_;
      if (((iVar2 <= lVar13) || ((int)lVar14 < 0)) || (iVar2 <= (int)lVar14)) goto LAB_0016526c;
      puVar5[lVar14] = puVar5[lVar13];
      lVar13 = lVar13 + 1;
      uVar11 = this->used_digits_;
      lVar14 = lVar14 + 1;
    } while (lVar13 < (int)uVar11);
    if ((int)uVar11 < 1) {
      uVar8 = 0;
    }
    else {
      puVar5 = (this->bigits_).start_;
      lVar14 = 0;
      uVar8 = 0;
      uVar15 = uVar1;
      do {
        iVar2 = (this->bigits_).length_;
        puVar6 = (this->bigits_).start_;
        lVar13 = lVar10;
        lVar17 = lVar14;
        do {
          if ((((int)(lVar10 + lVar17) < 0) || (iVar2 <= (int)uVar15)) ||
             (((int)lVar13 < 0 || (iVar2 <= (int)lVar13)))) goto LAB_0016526c;
          uVar8 = uVar8 + (ulong)puVar6[lVar13] * (ulong)puVar6[lVar10 + lVar17 & 0xffffffff];
          lVar13 = lVar13 + 1;
          bVar7 = lVar17 != 0;
          lVar17 = lVar17 + -1;
        } while (bVar7);
        if (iVar2 <= lVar14) goto LAB_0016526c;
        puVar5[lVar14] = (uint)uVar8 & 0xfffffff;
        uVar8 = uVar8 >> 0x1c;
        lVar14 = lVar14 + 1;
        uVar11 = this->used_digits_;
        uVar15 = uVar15 + 1;
      } while (lVar14 < (int)uVar11);
    }
  }
  iVar2 = uVar1 * 2;
  if (SBORROW4(uVar11,iVar2) != (int)(uVar11 + uVar1 * -2) < 0) {
    puVar5 = (this->bigits_).start_;
    uVar16 = (ulong)uVar11;
    iVar9 = uVar1 + uVar11;
    do {
      iVar9 = iVar9 + 1;
      iVar3 = (this->bigits_).length_;
      iVar4 = this->used_digits_;
      iVar12 = ((int)uVar16 - iVar4) + 1;
      if (iVar12 < iVar4) {
        puVar6 = (this->bigits_).start_;
        uVar19 = (uVar1 - 1) + iVar4;
        uVar18 = (ulong)(uint)(iVar9 - iVar4);
        uVar15 = uVar19;
        do {
          if ((((int)uVar15 < 0) || (iVar3 <= (int)uVar19)) ||
             (((int)uVar18 < 0 || (iVar3 <= (int)uVar18)))) goto LAB_0016526c;
          uVar8 = uVar8 + (ulong)puVar6[uVar18] * (ulong)puVar6[uVar15];
          iVar12 = iVar12 + 1;
          uVar18 = uVar18 + 1;
          uVar15 = uVar15 - 1;
        } while (iVar12 < iVar4);
      }
      if (((int)uVar11 < 0) || (iVar3 <= (int)uVar16)) {
LAB_0016526c:
        __assert_fail("0 <= index && index < length_",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/utils.h"
                      ,0xca,
                      "T &FIX::double_conversion::Vector<unsigned int>::operator[](int) const [T = unsigned int]"
                     );
      }
      puVar5[uVar16] = (uint)uVar8 & 0xfffffff;
      uVar8 = uVar8 >> 0x1c;
      uVar16 = uVar16 + 1;
    } while ((int)uVar16 < iVar2);
  }
  if (uVar8 != 0) {
    __assert_fail("accumulator == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/bignum.cc"
                  ,0x193,"void FIX::double_conversion::Bignum::Square()");
  }
  this->used_digits_ = iVar2;
  this->exponent_ = this->exponent_ << 1;
  Clamp(this);
  return;
}

Assistant:

void Bignum::Square() {
  ASSERT(IsClamped());
  int product_length = 2 * used_digits_;
  EnsureCapacity(product_length);

  // Comba multiplication: compute each column separately.
  // Example: r = a2a1a0 * b2b1b0.
  //    r =  1    * a0b0 +
  //        10    * (a1b0 + a0b1) +
  //        100   * (a2b0 + a1b1 + a0b2) +
  //        1000  * (a2b1 + a1b2) +
  //        10000 * a2b2
  //
  // In the worst case we have to accumulate nb-digits products of digit*digit.
  //
  // Assert that the additional number of bits in a DoubleChunk are enough to
  // sum up used_digits of Bigit*Bigit.
  if ((1 << (2 * (kChunkSize - kBigitSize))) <= used_digits_) {
    UNIMPLEMENTED();
  }
  DoubleChunk accumulator = 0;
  // First shift the digits so we don't overwrite them.
  int copy_offset = used_digits_;
  for (int i = 0; i < used_digits_; ++i) {
    bigits_[copy_offset + i] = bigits_[i];
  }
  // We have two loops to avoid some 'if's in the loop.
  for (int i = 0; i < used_digits_; ++i) {
    // Process temporary digit i with power i.
    // The sum of the two indices must be equal to i.
    int bigit_index1 = i;
    int bigit_index2 = 0;
    // Sum all of the sub-products.
    while (bigit_index1 >= 0) {
      Chunk chunk1 = bigits_[copy_offset + bigit_index1];
      Chunk chunk2 = bigits_[copy_offset + bigit_index2];
      accumulator += static_cast<DoubleChunk>(chunk1) * chunk2;
      bigit_index1--;
      bigit_index2++;
    }
    bigits_[i] = static_cast<Chunk>(accumulator) & kBigitMask;
    accumulator >>= kBigitSize;
  }
  for (int i = used_digits_; i < product_length; ++i) {
    int bigit_index1 = used_digits_ - 1;
    int bigit_index2 = i - bigit_index1;
    // Invariant: sum of both indices is again equal to i.
    // Inner loop runs 0 times on last iteration, emptying accumulator.
    while (bigit_index2 < used_digits_) {
      Chunk chunk1 = bigits_[copy_offset + bigit_index1];
      Chunk chunk2 = bigits_[copy_offset + bigit_index2];
      accumulator += static_cast<DoubleChunk>(chunk1) * chunk2;
      bigit_index1--;
      bigit_index2++;
    }
    // The overwritten bigits_[i] will never be read in further loop iterations,
    // because bigit_index1 and bigit_index2 are always greater
    // than i - used_digits_.
    bigits_[i] = static_cast<Chunk>(accumulator) & kBigitMask;
    accumulator >>= kBigitSize;
  }
  // Since the result was guaranteed to lie inside the number the
  // accumulator must be 0 now.
  ASSERT(accumulator == 0);

  // Don't forget to update the used_digits and the exponent.
  used_digits_ = product_length;
  exponent_ *= 2;
  Clamp();
}